

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_facade.cpp
# Opt level: O2

bool __thiscall
EmmyFacade::TcpConnect(EmmyFacade *this,lua_State *L,string *host,int port,string *err)

{
  bool bVar1;
  shared_ptr<SocketClientTransporter> c;
  
  Destroy(this);
  EmmyDebuggerManager::AddDebugger
            ((EmmyDebuggerManager *)&stack0xffffffffffffffc0,
             (lua_State *)&this->_emmyDebuggerManager);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  (*lua_sethook)(L,ReadyLuaHook,7,0);
  std::make_shared<SocketClientTransporter>();
  std::__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<Transporter,(__gnu_cxx::_Lock_policy)2> *)&this->transporter,
             &c.super___shared_ptr<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = SocketClientTransporter::Connect
                    (c.super___shared_ptr<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,host,port,err);
  if (bVar1) {
    WaitIDE(this,true,0);
  }
  else {
    (*lua_pushcclosure)(L,LuaError,0);
    (*lua_pushstring)(L,(err->_M_dataplus)._M_p);
    lua_call(L,1,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&c.super___shared_ptr<SocketClientTransporter,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return bVar1;
}

Assistant:

bool EmmyFacade::TcpConnect(lua_State *L, const std::string &host, int port, std::string &err) {
	Destroy();

	_emmyDebuggerManager.AddDebugger(L);

	SetReadyHook(L);

	const auto c = std::make_shared<SocketClientTransporter>();
	transporter = c;
	// c->SetHandler(shared_from_this());
	const auto suc = c->Connect(host, port, err);
	if (suc) {
		WaitIDE(true);
	} else {
		lua_pushcfunction(L, LuaError);
		lua_pushstring(L, err.c_str());
		lua_call(L, 1, 0);
	}
	return suc;
}